

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O3

void __thiscall
xray_re::xr_level_portals::load(xr_level_portals *this,uint32_t xrlc_version,xr_reader *r)

{
  uint32_t id;
  xr_reader *s;
  xr_reader *local_18;
  
  local_18 = (xr_reader *)0x0;
  if (xrlc_version == 5) {
    local_18 = xr_reader::open_chunk(r,7);
    if (local_18 != (xr_reader *)0x0) {
      load_v5(this,local_18);
    }
  }
  else {
    id = 6;
    if ((xrlc_version < 10) || (id = 4, 0xb < xrlc_version)) {
      local_18 = xr_reader::open_chunk(r,id);
      if (local_18 != (xr_reader *)0x0) {
        load_v8(this,local_18);
      }
    }
  }
  xr_reader::close_chunk(r,&local_18);
  return;
}

Assistant:

void xr_level_portals::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5) {
		s = r.open_chunk(FSL5_PORTALS);
		if (s)
			load_v5(*s);
	} else {
		if (xrlc_version <= XRLC_VERSION_9)
			s = r.open_chunk(FSL8_PORTALS);
		else if (xrlc_version >= XRLC_VERSION_12)
			s = r.open_chunk(FSL13_PORTALS);
		if (s)
			load_v8(*s);
	}
	r.close_chunk(s);
}